

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O0

value scope_metadata(scope sp)

{
  int iVar1;
  scope sp_00;
  char *pcVar2;
  set psVar3;
  value *ppvVar4;
  value pvVar5;
  vector pvVar6;
  value v_objects;
  value *v_objects_ptr;
  value v_classes;
  value *v_classes_ptr;
  value v_funcs;
  value *v_funcs_ptr;
  value v_array [3];
  value v;
  value *v_map;
  size_t in_stack_ffffffffffffff98;
  value *in_stack_ffffffffffffffa0;
  scope in_stack_ffffffffffffffa8;
  value local_38;
  value local_30;
  value local_28;
  value *local_8;
  
  local_8 = (value *)value_create_map(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  memset(&local_38,0,0x18);
  if (local_8 == (value *)0x0) {
    local_8 = (value *)0x0;
  }
  else {
    sp_00 = (scope)value_to_map((value)0x12915d);
    pcVar2 = (char *)scope_metadata_name(in_stack_ffffffffffffffa8);
    sp_00->name = pcVar2;
    if (sp_00->name == (char *)0x0) {
      value_type_destroy(v_classes);
      local_8 = (value *)0x0;
    }
    else {
      iVar1 = scope_metadata_array(sp_00,local_8);
      if (iVar1 == 0) {
        psVar3 = (set)value_create_array(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        ppvVar4 = value_to_array((value)0x1291e3);
        pvVar5 = value_create_string((char *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        *ppvVar4 = pvVar5;
        ppvVar4[1] = local_38;
        sp_00->objects = psVar3;
        pvVar6 = (vector)value_create_array(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        ppvVar4 = value_to_array((value)0x12923d);
        pvVar5 = value_create_string((char *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        *ppvVar4 = pvVar5;
        ppvVar4[1] = local_30;
        sp_00->call_stack = pvVar6;
        pcVar2 = (char *)value_create_array(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        ppvVar4 = value_to_array((value)0x129295);
        pvVar5 = value_create_string((char *)ppvVar4,(size_t)pcVar2);
        *ppvVar4 = pvVar5;
        ppvVar4[1] = local_28;
        sp_00[1].name = pcVar2;
      }
      else {
        value_type_destroy(v_classes);
        local_8 = (value *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

value scope_metadata(scope sp)
{
	value *v_map, v = value_create_map(NULL, 4);
	value v_array[3] = { NULL, NULL, NULL }; // 0: funcs, 1: cls, 2: obj

	if (v == NULL)
	{
		return NULL;
	}

	v_map = value_to_map(v);

	v_map[0] = scope_metadata_name(sp);

	if (v_map[0] == NULL)
	{
		value_type_destroy(v);
		return NULL;
	}

	/* Obtain all scope objects of each type (functions, classes and objects) */
	if (scope_metadata_array(sp, v_array) != 0)
	{
		value_type_destroy(v);
		return NULL;
	}

	/* Functions */
	static const char funcs[] = "funcs";
	value *v_funcs_ptr, v_funcs = value_create_array(NULL, 2);
	v_funcs_ptr = value_to_array(v_funcs);
	v_funcs_ptr[0] = value_create_string(funcs, sizeof(funcs) - 1);
	v_funcs_ptr[1] = v_array[0];
	v_map[1] = v_funcs;

	/* Classes */
	static const char classes[] = "classes";
	value *v_classes_ptr, v_classes = value_create_array(NULL, 2);
	v_classes_ptr = value_to_array(v_classes);
	v_classes_ptr[0] = value_create_string(classes, sizeof(classes) - 1);
	v_classes_ptr[1] = v_array[1];
	v_map[2] = v_classes;

	/* Objects */
	static const char objects[] = "objects";
	value *v_objects_ptr, v_objects = value_create_array(NULL, 2);
	v_objects_ptr = value_to_array(v_objects);
	v_objects_ptr[0] = value_create_string(objects, sizeof(objects) - 1);
	v_objects_ptr[1] = v_array[2];
	v_map[3] = v_objects;

	return v;
}